

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemma_name_reader.cc
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* uttamarin::ReadLemmaNamesFromSpthyFile
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *spthy_file_path)

{
  char cVar1;
  char cVar2;
  int iVar3;
  long *plVar4;
  istream *piVar5;
  long lVar6;
  ulong *puVar7;
  long *plVar8;
  size_type *psVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *lemma_names;
  string line;
  string tamarin_command;
  ifstream tamarin_stream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  ulong *local_298;
  ulong local_290;
  ulong local_288;
  long lStack_280;
  string local_278;
  string local_258;
  long *local_238;
  long local_230;
  long local_228;
  long lStack_220;
  
  std::operator+(&local_2b8,"tamarin-prover ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 spthy_file_path);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_2b8);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_288 = *puVar7;
    lStack_280 = plVar4[3];
    local_298 = &local_288;
  }
  else {
    local_288 = *puVar7;
    local_298 = (ulong *)*plVar4;
  }
  local_290 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_298,(ulong)kTamarinTempfilePath_abi_cxx11_);
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_228 = *plVar8;
    lStack_220 = plVar4[3];
    local_238 = &local_228;
  }
  else {
    local_228 = *plVar8;
    local_238 = (long *)*plVar4;
  }
  local_230 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_238);
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  psVar9 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_278.field_2._M_allocated_capacity = *psVar9;
    local_278.field_2._8_8_ = plVar4[3];
  }
  else {
    local_278.field_2._M_allocated_capacity = *psVar9;
    local_278._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_278._M_string_length = plVar4[1];
  *plVar4 = (long)psVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_238 != &local_228) {
    operator_delete(local_238,local_228 + 1);
  }
  if (local_298 != &local_288) {
    operator_delete(local_298,local_288 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  ExecuteShellCommand(&local_278);
  std::ifstream::ifstream((istream *)&local_238,(string *)&kTamarinTempfilePath_abi_cxx11_,_S_in);
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_290 = 0;
  local_288 = local_288 & 0xffffffffffffff00;
  local_298 = &local_288;
  do {
    do {
      cVar1 = (char)(istream *)&local_238;
      cVar2 = std::ios::widen((char)local_238[-3] + cVar1);
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&local_238,(string *)&local_298,cVar2);
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) goto LAB_00124870;
    } while (local_290 < 5);
    std::__cxx11::string::substr((ulong)&local_2b8,(ulong)&local_298);
    iVar3 = std::__cxx11::string::compare((char *)&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
  } while (iVar3 != 0);
LAB_00124870:
  while( true ) {
    cVar2 = std::ios::widen((char)local_238[-3] + cVar1);
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&local_238,(string *)&local_298,cVar2);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
    if (4 < local_290) {
      std::__cxx11::string::substr((ulong)&local_2b8,(ulong)&local_298);
      iVar3 = std::__cxx11::string::compare((char *)&local_2b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      if (iVar3 == 0) break;
    }
    lVar6 = std::__cxx11::string::find((char *)&local_298,0x136ac5,0);
    if (lVar6 != -1) {
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,local_298,local_290 + (long)local_298);
      ExtractLemmaName((string *)&local_2b8,&local_258);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_2b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
    }
  }
  remove(kTamarinTempfilePath_abi_cxx11_);
  if (local_298 != &local_288) {
    operator_delete(local_298,local_288 + 1);
  }
  std::ifstream::~ifstream(&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<string> ReadLemmaNamesFromSpthyFile(const string& spthy_file_path) {
  string tamarin_command = "tamarin-prover "  + spthy_file_path + 
    " 1> " + kTamarinTempfilePath + " 2> /dev/null";
  ExecuteShellCommand(tamarin_command);

  std::ifstream tamarin_stream {kTamarinTempfilePath, std::ifstream::in};
  vector<string> lemma_names;
  string line;

  // Move stream to begin of lemma name section
  while(std::getline(tamarin_stream, line) && 
        (line.size() < 5 || line.substr(0,5) != "====="));

  // Read lemma names
  while(std::getline(tamarin_stream, line) && 
      !(line.size() >= 5 && line.substr(0,5) == "=====")) {
      if(line.find("steps)") == std::string::npos) continue;
    lemma_names.push_back(ExtractLemmaName(line));
  }

  // Remove temp file
  std::remove(kTamarinTempfilePath.c_str());

  return lemma_names;
}